

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,double number,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  bool bVar1;
  int32_t iVar2;
  LocalizedNumberFormatter *status_00;
  undefined1 local_68 [8];
  UnicodeStringAppendable appendable;
  undefined1 local_48 [8];
  FormattedNumber output;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  double number_local;
  DecimalFormat *this_local;
  
  output._8_8_ = status;
  iVar2 = FieldPosition::getField(pos);
  if ((iVar2 != -1) || (bVar1 = fastFormatDouble(this,number,appendTo), !bVar1)) {
    status_00 = LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>::operator->
                          (&(this->fields->formatter).
                            super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>);
    icu_63::number::LocalizedNumberFormatter::formatDouble
              ((LocalizedNumberFormatter *)local_48,number,(UErrorCode *)status_00);
    iVar2 = UnicodeString::length(appendTo);
    fieldPositionHelper((FormattedNumber *)local_48,pos,iVar2,(UErrorCode *)output._8_8_);
    UnicodeStringAppendable::UnicodeStringAppendable((UnicodeStringAppendable *)local_68,appendTo);
    icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_48,(Appendable *)local_68);
    UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)local_68);
    icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_48);
  }
  return appendTo;
}

Assistant:

UnicodeString& DecimalFormat::format(double number, UnicodeString& appendTo, FieldPosition& pos,
                                     UErrorCode& status) const {
    if (pos.getField() == FieldPosition::DONT_CARE && fastFormatDouble(number, appendTo)) {
        return appendTo;
    }
    FormattedNumber output = fields->formatter->formatDouble(number, status);
    fieldPositionHelper(output, pos, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}